

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestorderCancelRejectGetString::TestorderCancelRejectGetString
          (TestorderCancelRejectGetString *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"orderCancelRejectGetString","MessageTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x3f2);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031e650;
  return;
}

Assistant:

TEST(orderCancelRejectGetString)
{
  OrderCancelReject object;

  object.set( OrderID( "ORDERID" ) );
  object.set( ClOrdID( "CLIENTID" ) );
  object.set( OrigClOrdID( "ORIGINALID" ) );
  object.set( OrdStatus( '1' ) );
  object.set( CxlRejResponseTo( '2' ) );

  CHECK_EQUAL( "8=FIX.4.2\0019=53\00135=9\00111=CLIENTID\00137=ORDERID\001"
               "39=1\00141=ORIGINALID\001434=2\00110=229\001",
               object.toString() );
}